

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void cancel_don(void)

{
  cancelled_don =
       (afternmv == Armor_on || afternmv == Gloves_on) ||
       (afternmv == Helmet_on || afternmv == Boots_on);
  afternmv = (_func_int *)0x0;
  nomovemsg = (char *)0x0;
  multi = 0;
  todelay = 0;
  taking_off = 0;
  return;
}

Assistant:

void cancel_don(void)
{
	/* the piece of armor we were donning/doffing has vanished, so stop
	 * wasting time on it (and don't dereference it when donning would
	 * otherwise finish)
	 */
	cancelled_don = (afternmv == Boots_on || afternmv == Helmet_on ||
			 afternmv == Gloves_on || afternmv == Armor_on);
	afternmv = 0;
	nomovemsg = NULL;
	multi = 0;
	todelay = 0;
	taking_off = 0L;
}